

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_throw::run_impl(statement_throw *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  runtime_error *this_00;
  string *this_01;
  string *psVar3;
  type_info *this_02;
  allocator local_39;
  var e;
  string local_30;
  
  cs_debugger_step_callback(&this->super_statement_base);
  local_30._M_dataplus._M_p = (pointer)(this->mTree).mRoot;
  runtime_type::parse_expr
            ((runtime_type *)&e,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(&local_30,0));
  if (e.mDat == (proxy *)0x0) {
    this_02 = (type_info *)&void::typeinfo;
  }
  else {
    iVar2 = (*(e.mDat)->data->_vptr_baseHolder[2])();
    this_02 = (type_info *)CONCAT44(extraout_var,iVar2);
  }
  bVar1 = std::type_info::operator!=(this_02,(type_info *)&lang_error::typeinfo);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_30,"Throwing unsupported exception.",&local_39);
    runtime_error::runtime_error(this_00,&local_30);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  this_01 = (string *)__cxa_allocate_exception(0x20);
  psVar3 = (string *)cs_impl::any::const_val<cs::lang_error>(&e);
  std::__cxx11::string::string(this_01,psVar3);
  __cxa_throw(this_01,&lang_error::typeinfo,lang_error::~lang_error);
}

Assistant:

void statement_throw::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		var e = context->instance->parse_expr(this->mTree.root());
		if (e.type() != typeid(lang_error))
			throw runtime_error("Throwing unsupported exception.");
		else
			throw e.const_val<lang_error>();
	}